

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digraph.h
# Opt level: O2

Count degDist(CGraph *g,VertexIdx *degdistarray)

{
  long lVar1;
  Count CVar2;
  long lVar3;
  
  for (lVar1 = 0; lVar3 = g->nVertices, lVar1 < lVar3; lVar1 = lVar1 + 1) {
    degdistarray[lVar1] = 0;
  }
  CVar2 = 0;
  for (lVar1 = 0; lVar1 < lVar3; lVar1 = lVar1 + 1) {
    lVar3 = g->offsets[lVar1 + 1] - g->offsets[lVar1];
    if (CVar2 < lVar3) {
      CVar2 = lVar3;
    }
    degdistarray[lVar3] = degdistarray[lVar3] + 1;
    lVar3 = g->nVertices;
  }
  return CVar2;
}

Assistant:

Count degDist(CGraph *g, VertexIdx *degdistarray) {
    VertexIdx deg, maxdeg = 0; // variable for maximum degree
    VertexIdx i; // index for looping

    for (i = 0; i < g->nVertices; ++i) //looping to initialize degdistarray to all zeroes
        degdistarray[i] = 0;

    for (i = 0; i < g->nVertices; ++i) {
        deg = g->offsets[i + 1] - g->offsets[i]; // computing degree of vertex i
        if (deg > maxdeg)
            maxdeg = deg; //update maximum degree

        degdistarray[deg]++; //increment number of degree deg vertices
    }

    return maxdeg; //return maximum degree
}